

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O2

void __thiscall cppcms::http::file::output_file(file *this,string *name,bool is_temporary)

{
  uint uVar1;
  int iVar2;
  cppcms_error *this_00;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  impl::file_buffer::name(&((this->d).ptr_)->fb,name);
  if ((int)CONCAT71(in_register_00000011,is_temporary) == 0) {
    iVar2 = impl::file_buffer::to_file(&((this->d).ptr_)->fb);
    if (iVar2 != 0) {
      this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
      std::operator+(&bStack_38,"Failed to write to file ",name);
      cppcms_error::cppcms_error(this_00,&bStack_38);
      __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    uVar1 = 2;
  }
  else {
    uVar1 = 6;
  }
  *(uint *)&this->field_0x440 = *(uint *)&this->field_0x440 & 0xfffffff9 | uVar1;
  return;
}

Assistant:

void file::output_file(std::string const &name,bool is_temporary)
{
	d->fb.name(name);
	if(!is_temporary) {
		if(d->fb.to_file()!=0) {
			throw cppcms_error("Failed to write to file " + name);
		}
	}
	file_specified_ = 1;
	file_temporary_ = is_temporary ? 1:0;

}